

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::detachClause(Solver *this,CRef cr,bool strict)

{
  uint64_t *puVar1;
  vec<Minisat::Watcher> *pvVar2;
  long *plVar3;
  uint *puVar4;
  vec<Minisat::Watcher> *pvVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined7 in_register_00000011;
  int iVar10;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *pOVar11;
  Lit local_28;
  Lit local_24;
  
  puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  pOVar11 = &this->watches;
  if ((uint)((ulong)*(undefined8 *)(puVar4 + cr) >> 0x22) == 2) {
    pOVar11 = &this->watches_bin;
  }
  puVar1 = &(this->statistics).solveSteps;
  *puVar1 = *puVar1 + 1;
  if ((int)CONCAT71(in_register_00000011,strict) == 0) {
    uVar7 = (long)(int)puVar4[(ulong)cr + 2] ^ 1;
    local_24.x = (int)uVar7;
    pcVar6 = (pOVar11->dirty).data;
    if (pcVar6[uVar7] == '\0') {
      pcVar6[uVar7] = '\x01';
      vec<Minisat::Lit>::push(&pOVar11->dirties,&local_24);
    }
    uVar7 = (long)(int)puVar4[(ulong)cr + 3] ^ 1;
    _local_28 = CONCAT44(local_24.x,(int)uVar7);
    pcVar6 = (pOVar11->dirty).data;
    if (pcVar6[uVar7] == '\0') {
      pcVar6[uVar7] = '\x01';
      vec<Minisat::Lit>::push(&pOVar11->dirties,&local_28);
    }
  }
  else {
    pvVar5 = (pOVar11->occs).data;
    pvVar2 = pvVar5 + ((long)(int)puVar4[(ulong)cr + 2] ^ 1U);
    uVar8 = pvVar5[(long)(int)puVar4[(ulong)cr + 2] ^ 1U].sz;
    if ((int)uVar8 < 1) {
      uVar7 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar7 = uVar9;
        if (pvVar2->data[uVar9].cref == cr) break;
        uVar9 = uVar9 + 1;
        uVar7 = (ulong)uVar8;
      } while (uVar8 != uVar9);
    }
    iVar10 = uVar8 - 1;
    if ((int)uVar7 < iVar10) {
      uVar9 = uVar7 & 0xffffffff;
      do {
        pvVar2->data[uVar9] = pvVar2->data[uVar9 + 1];
        iVar10 = pvVar2->sz + -1;
        uVar8 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar8;
        uVar9 = uVar9 + 1;
      } while ((int)uVar8 < iVar10);
    }
    pvVar2->sz = iVar10;
    pvVar5 = (pOVar11->occs).data;
    pvVar2 = pvVar5 + ((long)(int)puVar4[(ulong)cr + 3] ^ 1U);
    uVar8 = pvVar5[(long)(int)puVar4[(ulong)cr + 3] ^ 1U].sz;
    if ((int)uVar8 < 1) {
      uVar7 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar7 = uVar9;
        if (pvVar2->data[uVar9].cref == cr) break;
        uVar9 = uVar9 + 1;
        uVar7 = (ulong)uVar8;
      } while (uVar8 != uVar9);
    }
    iVar10 = uVar8 - 1;
    if ((int)uVar7 < iVar10) {
      uVar9 = uVar7 & 0xffffffff;
      do {
        pvVar2->data[uVar9] = pvVar2->data[uVar9 + 1];
        iVar10 = pvVar2->sz + -1;
        uVar8 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar8;
        uVar9 = uVar9 + 1;
      } while ((int)uVar8 < iVar10);
    }
    pvVar2->sz = iVar10;
  }
  plVar3 = (long *)((long)&this->clauses_literals + (ulong)((uint)*(ulong *)(puVar4 + cr) & 4) * 2);
  *plVar3 = *plVar3 - (*(ulong *)(puVar4 + cr) >> 0x22);
  return;
}

Assistant:

void Solver::detachClause(CRef cr, bool strict)
{
    const Clause &c = ca[cr];
    assert(c.size() > 1);

    OccLists<Lit, vec<Watcher>, WatcherDeleted> &ws = c.size() == 2 ? watches_bin : watches;
    statistics.solveSteps++;

    // Strict or lazy detaching:
    if (strict) {
        remove(ws[~c[0]], Watcher(cr, c[1]));
        remove(ws[~c[1]], Watcher(cr, c[0]));
    } else {
        // Lazy detaching: (NOTE! Must clean all watcher lists before garbage collecting this clause)
        ws.smudge(~c[0]);
        ws.smudge(~c[1]);
    }

    if (c.learnt())
        learnts_literals -= c.size();
    else
        clauses_literals -= c.size();
}